

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Omega_h_Parting OVar1;
  Int IVar2;
  void *extraout_RDX;
  int cell_dim;
  Read<signed_char> RVar3;
  Write<int> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<int> local_50;
  Omega_h local_40 [16];
  
  OVar1 = Mesh::parting(mesh);
  if (OVar1 == OMEGA_H_GHOSTED) {
    cell_dim = 2;
    while( true ) {
      IVar2 = Mesh::dim(mesh);
      if (IVar2 < cell_dim) break;
      Write<int>::Write(&local_50,&cands2edges->write_);
      Write<signed_char>::Write(&local_60,&cand_codes->write_);
      check_collapse_exposure
                (local_40,mesh,(LOs *)&local_50,(Read<signed_char> *)&local_60,cell_dim);
      Write<signed_char>::operator=(&cand_codes->write_,(Write<signed_char> *)local_40);
      Write<signed_char>::~Write((Write<signed_char> *)local_40);
      Write<signed_char>::~Write(&local_60);
      Write<int>::~Write(&local_50);
      cell_dim = cell_dim + 1;
    }
    Write<signed_char>::Write(&local_70,&cand_codes->write_);
    Write<int>::Write(&local_80,&cands2edges->write_);
    Mesh::sync_subset_array<signed_char>
              ((Mesh *)this,(Int)mesh,(Read<signed_char> *)0x1,(LOs *)&local_70,(char)&local_80,0);
    Write<int>::~Write(&local_80);
    Write<signed_char>::~Write(&local_70);
    RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar3.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_check_collapse.cpp"
       ,0x6e);
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  for (Int cell_dim = Int(EDGE) + 1; cell_dim <= mesh->dim(); ++cell_dim) {
    cand_codes =
        check_collapse_exposure(mesh, cands2edges, cand_codes, cell_dim);
  }
  return mesh->sync_subset_array(
      EDGE, cand_codes, cands2edges, I8(DONT_COLLAPSE), 1);
}